

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O3

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genAnnotations
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema schema)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader list;
  Schema scope;
  StringTree *pSVar2;
  WirePointer *id;
  Reader proto;
  Schema local_b0;
  Reader local_a8;
  ListReader local_78;
  PointerReader local_48;
  
  local_b0.raw = schema.raw;
  Schema::getProto(&local_a8,&local_b0);
  id = (WirePointer *)0x0;
  local_48.pointer = local_a8._reader.pointers + 2;
  if (local_a8._reader.pointerCount < 3) {
    local_48.pointer = id;
  }
  if (local_a8._reader.pointerCount < 3) {
    local_a8._reader.segment._0_4_ = 0;
    local_a8._reader.segment._4_4_ = 0;
    local_a8._reader.capTable._0_4_ = 0;
    local_a8._reader.capTable._4_4_ = 0;
    local_a8._reader.nestingLimit = 0x7fffffff;
  }
  local_48.segment._0_4_ = local_a8._reader.segment._0_4_;
  local_48.segment._4_4_ = local_a8._reader.segment._4_4_;
  local_48.capTable._0_4_ = local_a8._reader.capTable._0_4_;
  local_48.capTable._4_4_ = local_a8._reader.capTable._4_4_;
  local_48.nestingLimit = local_a8._reader.nestingLimit;
  _::PointerReader::getList(&local_78,&local_48,INLINE_COMPOSITE,(word *)0x0);
  if (0xbf < local_a8._reader.dataSize) {
    id = *(WirePointer **)((long)local_a8._reader.data + 0x10);
  }
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  scope = SchemaLoader::get(&this->schemaLoader,(uint64_t)id,brand,(Schema)0x1c5ce0);
  list.reader.capTable = local_78.capTable;
  list.reader.segment = local_78.segment;
  list.reader.ptr = local_78.ptr;
  list.reader.elementCount = local_78.elementCount;
  list.reader.step = local_78.step;
  list.reader.structDataSize = local_78.structDataSize;
  list.reader.structPointerCount = local_78.structPointerCount;
  list.reader.elementSize = local_78.elementSize;
  list.reader._39_1_ = local_78._39_1_;
  list.reader.nestingLimit = local_78.nestingLimit;
  list.reader._44_4_ = local_78._44_4_;
  pSVar2 = genAnnotations(__return_storage_ptr__,this,list,scope);
  return pSVar2;
}

Assistant:

kj::StringTree genAnnotations(Schema schema) {
    auto proto = schema.getProto();
    return genAnnotations(proto.getAnnotations(), schemaLoader.get(proto.getScopeId()));
  }